

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

dgMeshEffect * __thiscall dgMeshEffect::GetNextLayer(dgMeshEffect *this,HaI32 mark)

{
  double dVar1;
  dgTreeNode *pdVar2;
  dgRedBackNode *pdVar3;
  dgMeshEffect *this_00;
  dgRedBackNode *pdVar4;
  long lVar5;
  dgPolyhedra polyhedra;
  HaI32 faceIndex [256];
  HaI64 faceDataIndex [256];
  Iterator local_c70;
  dgPolyhedra local_c60;
  HaI32 local_c38 [256];
  HaI64 local_838 [257];
  
  pdVar2 = (this->super_dgPolyhedra).super_dgTree<dgEdge,_long>.m_head;
  if ((pdVar2 == (dgTreeNode *)0x0) ||
     (local_c70.m_tree = (dgTree<dgEdge,_long> *)this,
     local_c70.m_ptr = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode),
     local_c70.m_ptr == (dgRedBackNode *)0x0)) {
    return (dgMeshEffect *)0x0;
  }
  do {
    pdVar3 = local_c70.m_ptr;
    if ((*(int *)&local_c70.m_ptr[2]._vptr_dgRedBackNode < mark) &&
       (0 < *(int *)((long)&local_c70.m_ptr[1]._vptr_dgRedBackNode + 4))) break;
    dgTree<dgEdge,_long>::Iterator::operator++(&local_c70,0);
  } while (local_c70.m_ptr != (dgRedBackNode *)0x0);
  dVar1 = this->m_points[*(int *)&pdVar3[1]._vptr_dgRedBackNode].super_dgTemplateVector<double>.m_w;
  dgPolyhedra::dgPolyhedra(&local_c60);
  pdVar2 = (((dgPolyhedra *)&(local_c70.m_tree)->_vptr_dgTree)->super_dgTree<dgEdge,_long>).m_head;
  if (pdVar2 == (dgTreeNode *)0x0) {
    local_c70.m_ptr = (dgRedBackNode *)0x0;
  }
  else {
    local_c70.m_ptr = dgRedBackNode::Minimum(&pdVar2->super_dgRedBackNode);
  }
  if (local_c70.m_ptr != (dgRedBackNode *)0x0) {
    do {
      if (((*(int *)&local_c70.m_ptr[2]._vptr_dgRedBackNode < mark) &&
          (0 < *(int *)((long)&local_c70.m_ptr[1]._vptr_dgRedBackNode + 4))) &&
         (pdVar3 = local_c70.m_ptr + 1,
         (int)this->m_points[*(int *)&pdVar3->_vptr_dgRedBackNode].super_dgTemplateVector<double>.
              m_w == (int)dVar1)) {
        lVar5 = 0;
        pdVar4 = pdVar3;
        do {
          *(HaI32 *)&pdVar4[1]._vptr_dgRedBackNode = mark;
          local_c38[lVar5] = *(HaI32 *)&pdVar4->_vptr_dgRedBackNode;
          local_838[lVar5] = (HaI64)pdVar4->m_left;
          if (lVar5 == 0xff) {
            __assert_fail("count < hacd::HaI32 (sizeof (faceIndex)/ sizeof(faceIndex[0]))",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                          ,0x937,"dgMeshEffect *dgMeshEffect::GetNextLayer(hacd::HaI32)");
          }
          pdVar4 = pdVar4->m_right;
          lVar5 = lVar5 + 1;
        } while (pdVar4 != pdVar3);
        dgPolyhedra::AddFace(&local_c60,(HaI32)lVar5,local_c38,local_838);
      }
      dgTree<dgEdge,_long>::Iterator::operator++(&local_c70,0);
    } while (local_c70.m_ptr != (dgRedBackNode *)0x0);
  }
  dgPolyhedra::EndFace(&local_c60);
  if (local_c60.super_dgTree<dgEdge,_long>.m_count == 0) {
    this_00 = (dgMeshEffect *)0x0;
  }
  else {
    this_00 = (dgMeshEffect *)malloc(0x58);
    dgMeshEffect(this_00,&local_c60,this);
    if ((this_00->super_dgPolyhedra).m_edgeMark < mark) {
      (this_00->super_dgPolyhedra).m_edgeMark = mark;
    }
  }
  dgPolyhedra::~dgPolyhedra(&local_c60);
  return this_00;
}

Assistant:

dgMeshEffect* dgMeshEffect::GetNextLayer (hacd::HaI32 mark)
{
	Iterator iter(*this);
	dgEdge* edge = NULL;
	for (iter.Begin (); iter; iter ++) {
		edge = &(*iter);
		if ((edge->m_mark < mark) && (edge->m_incidentFace > 0)) {
			break;
		}
	}

	if (!edge) {
		return NULL;
	}

	hacd::HaI32 layer = hacd::HaI32 (m_points[edge->m_incidentVertex].m_w);
	dgPolyhedra polyhedra;

	polyhedra.BeginFace ();
	for (iter.Begin (); iter; iter ++) {
		dgEdge* const edge = &(*iter);
		if ((edge->m_mark < mark) && (edge->m_incidentFace > 0)) {
			hacd::HaI32 thislayer = hacd::HaI32 (m_points[edge->m_incidentVertex].m_w);
			if (thislayer == layer) {
				dgEdge* ptr = edge;
				hacd::HaI32 count = 0;
				hacd::HaI32 faceIndex[256];
				hacd::HaI64 faceDataIndex[256];
				do {
					ptr->m_mark = mark;
					faceIndex[count] = ptr->m_incidentVertex;
					faceDataIndex[count] = ptr->m_userData;
					count ++;
					HACD_ASSERT (count < hacd::HaI32 (sizeof (faceIndex)/ sizeof(faceIndex[0])));
					ptr = ptr->m_next;
				} while (ptr != edge);
				polyhedra.AddFace (count, &faceIndex[0], &faceDataIndex[0]);
			}
		}
	}
	polyhedra.EndFace ();

	dgMeshEffect* solid = NULL;
	if (polyhedra.GetCount()) {
		solid = HACD_NEW(dgMeshEffect)(polyhedra, *this);
		solid->SetLRU(mark);
	}
	return solid;
}